

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initLibrarianTool(VcprojGenerator *this)

{
  QString *this_00;
  QMakeProject *pQVar1;
  ProStringList *this_01;
  long in_FS_OFFSET;
  ProKey PStack_a8;
  ProString local_78;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->vcProject).Configuration.librarian.OutputFile;
  QString::operator=(this_00,"$(OutDir)\\");
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&PStack_a8,"MSVCPROJ_TARGET");
  QMakeEvaluator::first(&local_78,&pQVar1->super_QMakeEvaluator,&PStack_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  QString::append((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_a8);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_78,"QMAKE_LIBFLAGS");
  this_01 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_78);
  ProStringList::toQStringList((QStringList *)&PStack_a8,this_01);
  QList<QString>::append
            (&(this->vcProject).Configuration.librarian.AdditionalOptions,
             (QList<QString> *)&PStack_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&PStack_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initLibrarianTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    conf.librarian.OutputFile = "$(OutDir)\\";
    conf.librarian.OutputFile += project->first("MSVCPROJ_TARGET").toQString();
    conf.librarian.AdditionalOptions += project->values("QMAKE_LIBFLAGS").toQStringList();
}